

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O0

void __thiscall wallet::CKeyMetadata::SetNull(CKeyMetadata *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&(in_RDI->_M_dataplus)._M_p = 0xc;
  in_RDI->_M_string_length = 0;
  this_00 = in_RDI;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(in_RDI);
  base_blob<160U>::SetNull((base_blob<160U> *)this_00);
  KeyOriginInfo::clear((KeyOriginInfo *)in_RDI);
  *(undefined1 *)&in_RDI[3]._M_string_length = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetNull()
    {
        nVersion = CKeyMetadata::CURRENT_VERSION;
        nCreateTime = 0;
        hdKeypath.clear();
        hd_seed_id.SetNull();
        key_origin.clear();
        has_key_origin = false;
    }